

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_dofo(_garray *x,long npoints,t_float dcval,int nsin,t_float *vsin,int sineflag)

{
  float fVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  _array *p_Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  int elemsize;
  int yonset;
  double local_68;
  undefined8 uStack_60;
  _garray *local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  p_Var6 = garray_getarray_floatonly(x,&yonset,&elemsize);
  if (p_Var6 != (_array *)0x0) {
    lVar8 = 0x200;
    if (npoints != 0) {
      lVar8 = npoints;
    }
    local_58 = x;
    iVar5 = ilog2((int)lVar8);
    if (lVar8 != 1 << ((byte)iVar5 & 0x1f)) {
      pcVar2 = p_Var6->a_templatesym->s_name;
      iVar5 = ilog2((int)lVar8);
      lVar8 = (long)(1 << ((byte)iVar5 & 0x1f));
      post("%s: rounding to %d points",pcVar2,lVar8);
    }
    garray_resize_long(local_58,lVar8 + 3);
    local_48 = 6.28318 / (double)lVar8;
    uStack_40 = 0;
    local_68 = -local_48;
    uStack_60 = 0x8000000000000000;
    local_50 = (long)elemsize;
    uVar7 = 0;
    uVar9 = (ulong)(uint)nsin;
    if (nsin < 1) {
      uVar9 = uVar7;
    }
    for (; (long)uVar7 < (long)p_Var6->a_n; uVar7 = uVar7 + 1) {
      if (sineflag == 0) {
        dVar4 = 0.0;
        dVar11 = 0.0;
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          fVar1 = vsin[uVar10];
          dVar3 = cos(dVar4);
          dVar11 = dVar11 + dVar3 * (double)fVar1;
          dVar4 = dVar4 + local_68;
        }
      }
      else {
        dVar11 = 0.0;
        dVar4 = local_68;
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          fVar1 = vsin[uVar10];
          dVar3 = sin(dVar4);
          dVar11 = dVar11 + dVar3 * (double)fVar1;
          dVar4 = dVar4 + local_68;
        }
      }
      *(float *)(p_Var6->a_vec + (long)yonset * 4 + uVar7 * local_50) = (float)dVar11;
      local_68 = local_68 + local_48;
    }
    garray_redraw(local_58);
    return;
  }
  pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
  return;
}

Assistant:

static void garray_dofo(t_garray *x, long npoints, t_float dcval,
    int nsin, t_float *vsin, int sineflag)
{
    double phase, phaseincr, fj;
    int yonset, i, j, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    if (npoints == 0)
        npoints = 512;  /* dunno what a good default would be... */
    if (npoints != (1 << ilog2((int)npoints)))
        post("%s: rounding to %d points", array->a_templatesym->s_name,
            (npoints = (1<<ilog2((int)npoints))));
    garray_resize_long(x, npoints + 3);
    phaseincr = 2. * 3.14159 / npoints;
    for (i = 0, phase = -phaseincr; i < array->a_n; i++, phase += phaseincr)
    {
        double sum = dcval;
        if (sineflag)
            for (j = 0, fj = phase; j < nsin; j++, fj += phase)
                sum += vsin[j] * sin(fj);
        else
            for (j = 0, fj = 0; j < nsin; j++, fj += phase)
                sum += vsin[j] * cos(fj);
        *((t_float *)((array->a_vec + elemsize * i)) + yonset)
            = sum;
    }
    garray_redraw(x);
}